

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_sethook(lua_State *L)

{
  int idx;
  uint uVar1;
  int iVar2;
  lua_State *L1;
  char *pcVar3;
  lua_Integer lVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  code *func;
  int local_40;
  int arg;
  
  L1 = getthread(L,&arg);
  idx = arg + 1;
  iVar2 = lua_type(L,idx);
  if (iVar2 < 1) {
    lua_settop(L,idx);
    func = (lua_Hook)0x0;
    local_40 = 0;
    uVar7 = 0;
  }
  else {
    pcVar3 = luaL_checklstring(L,arg + 2,(size_t *)0x0);
    luaL_checktype(L,idx,6);
    lVar4 = luaL_optinteger(L,arg + 3,0);
    local_40 = (int)lVar4;
    pcVar5 = strchr(pcVar3,99);
    pcVar6 = strchr(pcVar3,0x72);
    uVar7 = (pcVar5 != (char *)0x0) + 2;
    if (pcVar6 == (char *)0x0) {
      uVar7 = (uint)(pcVar5 != (char *)0x0);
    }
    pcVar3 = strchr(pcVar3,0x6c);
    uVar1 = uVar7 + 4;
    if (pcVar3 == (char *)0x0) {
      uVar1 = uVar7;
    }
    uVar7 = uVar1 + 8;
    if (local_40 < 1) {
      uVar7 = uVar1;
    }
    func = hookf;
  }
  iVar2 = lua_rawgetp(L,-0xf4628,&HOOKKEY);
  if (iVar2 == 0) {
    lua_createtable(L,0,2);
    lua_pushvalue(L,-1);
    lua_rawsetp(L,-0xf4628,&HOOKKEY);
    lua_pushstring(L,"k");
    lua_setfield(L,-2,"__mode");
    lua_pushvalue(L,-1);
    lua_setmetatable(L,-2);
  }
  checkstack(L,L1,1);
  lua_pushthread(L1);
  lua_xmove(L1,L,1);
  lua_pushvalue(L,idx);
  lua_rawset(L,-3);
  lua_sethook(L1,func,uVar7,local_40);
  return 0;
}

Assistant:

static int db_sethook (lua_State *L) {
  int arg, mask, count;
  lua_Hook func;
  lua_State *L1 = getthread(L, &arg);
  if (lua_isnoneornil(L, arg+1)) {  /* no hook? */
    lua_settop(L, arg+1);
    func = NULL; mask = 0; count = 0;  /* turn off hooks */
  }
  else {
    const char *smask = luaL_checkstring(L, arg+2);
    luaL_checktype(L, arg+1, LUA_TFUNCTION);
    count = (int)luaL_optinteger(L, arg + 3, 0);
    func = hookf; mask = makemask(smask, count);
  }
  if (lua_rawgetp(L, LUA_REGISTRYINDEX, &HOOKKEY) == LUA_TNIL) {
    lua_createtable(L, 0, 2);  /* create a hook table */
    lua_pushvalue(L, -1);
    lua_rawsetp(L, LUA_REGISTRYINDEX, &HOOKKEY);  /* set it in position */
    lua_pushstring(L, "k");
    lua_setfield(L, -2, "__mode");  /** hooktable.__mode = "k" */
    lua_pushvalue(L, -1);
    lua_setmetatable(L, -2);  /* setmetatable(hooktable) = hooktable */
  }
  checkstack(L, L1, 1);
  lua_pushthread(L1); lua_xmove(L1, L, 1);  /* key (thread) */
  lua_pushvalue(L, arg + 1);  /* value (hook function) */
  lua_rawset(L, -3);  /* hooktable[L1] = new Lua hook */
  lua_sethook(L1, func, mask, count);
  return 0;
}